

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

u32 dec_parse_abs_mvd(com_lbac_t *lbac,lbac_ctx_model_t *model)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  
  uVar4 = lbac_dec_bin(lbac,model);
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = lbac_dec_bin(lbac,model + 1);
    if (uVar4 == 0) {
      uVar4 = 1;
    }
    else {
      uVar4 = lbac_dec_bin(lbac,model + 2);
      if (uVar4 == 0) {
        uVar4 = 2;
      }
      else {
        uVar4 = lbac_dec_bin_ep(lbac);
        iVar10 = lbac->range * 0x10000;
        uVar13 = lbac->low;
        iVar7 = 0;
        do {
          iVar8 = iVar7;
          uVar11 = uVar13;
          iVar7 = iVar10;
          if ((int)uVar11 <= iVar10) {
            iVar7 = 0;
          }
          uVar13 = (uVar11 - iVar7) * 2;
          if ((uVar11 & 0x7fff) == 0) {
            uVar5 = (int)(uVar13 - 1 ^ uVar13) >> 0xf;
            iVar7 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            pbVar3 = lbac->cur;
            bVar1 = *pbVar3;
            bVar2 = pbVar3[1];
            pbVar12 = pbVar3 + 2;
            if (lbac->end <= pbVar3 + 2) {
              pbVar12 = lbac->end;
            }
            lbac->cur = pbVar12;
            uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                     (0x1e - ((byte)iVar7 ^ 0x1f) & 0x1f)) + uVar13;
          }
          iVar7 = (uint)((int)uVar11 <= iVar10) + iVar8;
        } while (((int)uVar11 <= iVar10) && (lbac->cur < lbac->end));
        lbac->low = uVar13;
        if (iVar7 < 1) {
          iVar8 = 0;
        }
        else {
          uVar5 = iVar8 + (uint)((int)uVar11 <= iVar10) + 1;
          iVar8 = 0;
          uVar11 = uVar13;
          do {
            iVar9 = 0;
            if (iVar10 < (int)uVar11) {
              iVar9 = iVar10;
            }
            uVar13 = (uVar11 - iVar9) * 2;
            if ((uVar11 & 0x7fff) == 0) {
              uVar6 = (int)(uVar13 - 1 ^ uVar13) >> 0xf;
              iVar9 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                }
              }
              pbVar3 = lbac->cur;
              bVar1 = *pbVar3;
              bVar2 = pbVar3[1];
              pbVar12 = pbVar3 + 2;
              if (lbac->end <= pbVar3 + 2) {
                pbVar12 = lbac->end;
              }
              lbac->cur = pbVar12;
              uVar13 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                       (0x1e - ((byte)iVar9 ^ 0x1f) & 0x1f)) + uVar13;
            }
            iVar8 = (uint)(iVar10 < (int)uVar11) + iVar8 * 2;
            uVar5 = uVar5 - 1;
            uVar11 = uVar13;
          } while (1 < uVar5);
        }
        lbac->low = uVar13;
        uVar4 = (uVar4 & 1) + (iVar8 + ~(-1 << ((byte)iVar7 & 0x1f))) * 2 + 3;
      }
    }
  }
  return uVar4;
}

Assistant:

static u32 dec_parse_abs_mvd(com_lbac_t *lbac, lbac_ctx_model_t *model)
{
    u32 act_sym;

    if (!lbac_dec_bin(lbac, model)) {
        act_sym = 0;
    } else if (!lbac_dec_bin(lbac, model + 1)) {
        act_sym = 1;
    } else if (!lbac_dec_bin(lbac, model + 2)) {
        act_sym = 2;
    } else {
        int add_one = lbac_dec_bin_ep(lbac) & 1;
        int golomb_order = lbac_read_unary_sym_ep(lbac);
        act_sym = (1 << golomb_order) - 1 + lbac_read_bins_ep_msb(lbac, golomb_order);
        act_sym = 3 + act_sym * 2 + add_one;
    }

    return act_sym;
}